

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.c
# Opt level: O0

_Bool golf_level_unload(golf_level_t *level)

{
  golf_level_t *level_local;
  
  return false;
}

Assistant:

static bool _golf_level_unload(void *ptr) {
    golf_level_t *level = (golf_level_t*) ptr;

    for (int i = 0; i < level->deps.length; i++) {
        golf_data_unload(level->deps.data[i].path);
    }

    for (int i = 0; i < level->lightmap_images.length; i++) {
        golf_lightmap_image_t *lightmap_image = &level->lightmap_images.data[i];
        for (int i = 0; i < lightmap_image->num_samples; i++) {
            sg_destroy_image(lightmap_image->sg_image[i]);
            free(lightmap_image->data[i]);
        }
        golf_free(lightmap_image->data);
        golf_free(lightmap_image->sg_image);
    }

    for (int i = 0; i < level->entities.length; i++) {
        golf_entity_t *entity = &level->entities.data[i];

        golf_lightmap_section_t *lightmap_section = golf_entity_get_lightmap_section(entity);
        if (lightmap_section) {
            vec_deinit(&lightmap_section->uvs);
        }

        golf_geo_t *geo = golf_entity_get_geo(entity);
        if (geo) {
            for (int i = 0; i < geo->faces.length; i++) {
                golf_geo_face_t *face = &geo->faces.data[i];
                vec_deinit(&face->idx);
                vec_deinit(&face->uvs);
            }

            vec_deinit(&geo->points);
            vec_deinit(&geo->faces);
            vec_deinit(&geo->generator_data.args);

            vec_deinit(&geo->model.groups);
            vec_deinit(&geo->model.positions);
            vec_deinit(&geo->model.normals);
            vec_deinit(&geo->model.texcoords);
            if (geo->model.is_water) {
                vec_deinit(&geo->model.water_dir);
            }

            if (geo->model.sg_size > 0) {
                sg_destroy_buffer(geo->model.sg_positions_buf);
                sg_destroy_buffer(geo->model.sg_normals_buf);
                sg_destroy_buffer(geo->model.sg_texcoords_buf);
            }
        }
    }

    vec_deinit(&level->materials);
    vec_deinit(&level->lightmap_images);
    vec_deinit(&level->entities);
    vec_deinit(&level->deps);

    return true;
}